

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O1

int nn_port_resolve(char *port,size_t portlen)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  if (portlen == 0) {
    iVar3 = 0;
  }
  else {
    sVar2 = 0;
    iVar3 = 0;
    do {
      if (((byte)(port[sVar2] - 0x3aU) < 0xf6) ||
         (iVar3 = (uint)(byte)(port[sVar2] - 0x30) + iVar3 * 10, 0xffff < iVar3)) {
        return -0x16;
      }
      sVar2 = sVar2 + 1;
    } while (portlen != sVar2);
  }
  iVar1 = -0x16;
  if (iVar3 != 0) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int nn_port_resolve (const char *port, size_t portlen)
{
    int res;
    size_t i;

    res = 0;
    for (i = 0; i != portlen; ++i) {
        if (port [i] < '0' || port [i] > '9')
            return -EINVAL;
        res *= 10;
        res += port [i] - '0';
        if (res > 0xffff)
            return -EINVAL;
    }

    /*  Port 0 has special meaning (assign an ephemeral port to the socket),
        thus it is illegal to use it in the connection string. */
    if (res == 0)
        return -EINVAL;

    return res;
}